

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  bool bVar1;
  FieldOptions *options;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  location.location_ = (Location *)field_location;
  bVar1 = LookingAt(this,"[");
  if (bVar1) {
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_38,(LocationRecorder *)location.location_,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        bVar1 = LookingAt(this,"default");
        if (bVar1) {
          bVar1 = ParseDefaultAssignment(this,field,(LocationRecorder *)location.location_);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_00357b81;
          }
        }
        else {
          options = FieldDescriptorProto::mutable_options(field);
          bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_38,
                              OPTION_ASSIGNMENT);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_00357b81;
          }
        }
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
LAB_00357b81:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location));
    } else {
      DO(ParseOption(field->mutable_options(), location, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}